

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
xLearn::FFMParser::Parse(FFMParser *this,char *buf,uint64 size,DMatrix *matrix,bool reset)

{
  undefined1 auVar1 [16];
  bool bVar2;
  DMatrix *pDVar3;
  index_t iVar4;
  index_t iVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  ostream *poVar9;
  DMatrix *this_00;
  uint64 pos;
  float fVar10;
  double dVar11;
  float local_b0;
  Logger local_ac;
  DMatrix *local_a8;
  index_t local_a0;
  real_t local_9c;
  uint64 local_98;
  string local_90;
  string local_70;
  uint64 local_50;
  char *local_48;
  long local_40;
  uint64 local_38;
  
  local_a8 = matrix;
  local_48 = buf;
  if (buf == (char *)0x0) {
    local_ac.severity_ = ERR;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/parser.cc"
               ,"");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Parse","");
    poVar9 = Logger::Start(ERR,&local_70,0x8b,&local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/parser.cc"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x8b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"buf",3);
    std::operator<<(poVar9," == NULL \n");
  }
  else {
    if (size != 0) {
      this_00 = (DMatrix *)this;
      if (reset) {
        DMatrix::Reset(matrix);
        this_00 = matrix;
      }
      pos = 0;
      local_50 = size;
      do {
        local_98 = Parser::get_line_from_buffer((Parser *)this_00,line_buf,local_48,pos,size);
        pDVar3 = local_a8;
        if (local_98 != 0) {
          DMatrix::AddRow(local_a8);
          iVar4 = pDVar3->row_length;
          fVar10 = -2.0;
          if ((this->super_Parser).has_label_ == true) {
            pcVar6 = strtok(line_buf,(this->super_Parser).splitor_._M_dataplus._M_p);
            dVar11 = atof(pcVar6);
            fVar10 = (float)dVar11;
          }
          local_a0 = iVar4 - 1;
          local_40 = (long)(int)local_a0;
          (local_a8->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[local_40] = fVar10;
          local_b0 = 0.0;
          if ((this->super_Parser).has_label_ == false) {
            pcVar6 = strtok(line_buf,":");
            pcVar7 = strtok((char *)0x0,":");
            pcVar8 = strtok((char *)0x0,(this->super_Parser).splitor_._M_dataplus._M_p);
            if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\n')) {
              iVar4 = atoi(pcVar7);
              dVar11 = atof(pcVar8);
              fVar10 = (float)dVar11;
              iVar5 = atoi(pcVar6);
              DMatrix::AddNode(local_a8,local_a0,iVar4,fVar10,iVar5);
              auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),ZEXT416(0));
              local_b0 = auVar1._0_4_;
            }
          }
          local_38 = pos + local_98;
          do {
            bVar2 = false;
            pcVar6 = strtok((char *)0x0,":");
            pcVar7 = strtok((char *)0x0,":");
            this_00 = (DMatrix *)0x0;
            pcVar8 = strtok((char *)0x0,(this->super_Parser).splitor_._M_dataplus._M_p);
            if (pcVar6 != (char *)0x0) {
              if (*pcVar6 == '\n') {
                bVar2 = false;
              }
              else {
                iVar4 = atoi(pcVar7);
                dVar11 = atof(pcVar8);
                local_9c = (real_t)dVar11;
                iVar5 = atoi(pcVar6);
                this_00 = local_a8;
                DMatrix::AddNode(local_a8,local_a0,iVar4,local_9c,iVar5);
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)local_b0),ZEXT416((uint)local_9c),
                                         ZEXT416((uint)local_9c));
                local_b0 = auVar1._0_4_;
                bVar2 = true;
              }
            }
          } while (bVar2);
          (local_a8->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[local_40] = 1.0 / local_b0;
          size = local_50;
          pos = local_38;
        }
      } while (local_98 != 0);
      return;
    }
    local_ac.severity_ = ERR;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/parser.cc"
               ,"");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Parse","");
    poVar9 = Logger::Start(ERR,&local_70,0x8c,&local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"CHECK_GT failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/parser.cc"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x8c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"size",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0);
    std::operator<<(poVar9,"\n");
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  Logger::~Logger(&local_ac);
  abort();
}

Assistant:

void FFMParser::Parse(char* buf, 
                      uint64 size, 
                      DMatrix& matrix,
                      bool reset) {
  CHECK_NOTNULL(buf);
  CHECK_GT(size, 0);
  // Clear the data matrix
  if (reset) { 
    matrix.Reset(); 
  }
  // Parse every line
  uint64 pos = 0;
  for (;;) {
    uint64 rd_size = get_line_from_buffer(line_buf, buf, pos, size);
    if (rd_size == 0) break;
    pos += rd_size;
    matrix.AddRow();
    int i = matrix.row_length - 1;
    // Add Y
    if (has_label_) {  // for training task
      char *y_char = strtok(line_buf, splitor_.c_str());
      matrix.Y[i] = atof(y_char);
    } else {  // for predict task
      matrix.Y[i] = -2;
    }
    // Add features
    real_t norm = 0.0;
    // The first element
    if (!has_label_) {
      char *field_char = strtok(line_buf, ":");
      char *idx_char = strtok(nullptr, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (idx_char != nullptr && *idx_char != '\n') {
        index_t idx = atoi(idx_char);
        real_t value = atof(value_char);
        index_t field_id = atoi(field_char);
        matrix.AddNode(i, idx, value, field_id);
        norm += value*value;
      }
    }
    // The remain elements
    for (;;) {
      char *field_char = strtok(nullptr, ":");
      char *idx_char = strtok(nullptr, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (field_char == nullptr || *field_char == '\n') {
        break;
      }
      index_t idx = atoi(idx_char);
      real_t value = atof(value_char);
      index_t field_id = atoi(field_char);
      matrix.AddNode(i, idx, value, field_id);
      norm += value*value;
    }
    norm = 1.0f / norm;
    matrix.norm[i] = norm;
  }
}